

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O3

Gia_Man_t *
Dar_NewChoiceSynthesis
          (Aig_Man_t *pAig,int fBalance,int fUpdateLevel,int fPower,int fLightSynth,int fVerbose)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  Vec_Ptr_t *vGias;
  void **ppvVar4;
  Gia_Man_t *pGVar5;
  Aig_Man_t *pAVar6;
  long lVar7;
  
  if (fUpdateLevel != 0) {
    iVar3 = Dar_NewChoiceSynthesisGuard(pAig);
    if (iVar3 == 0) goto LAB_004b443b;
    if (fVerbose != 0) {
      puts("Warning: Due to high fanout count of some nodes, level updating is disabled.");
    }
  }
  fUpdateLevel = 0;
LAB_004b443b:
  vGias = (Vec_Ptr_t *)malloc(0x10);
  vGias->nCap = 8;
  ppvVar4 = (void **)malloc(0x40);
  vGias->pArray = ppvVar4;
  pGVar5 = Gia_ManFromAig(pAig);
  *ppvVar4 = pGVar5;
  pAVar6 = Dar_NewCompress(pAig,fBalance,fUpdateLevel,fPower,fVerbose);
  pGVar5 = Gia_ManFromAig(pAVar6);
  ppvVar4[1] = pGVar5;
  pAVar6 = Dar_NewCompress2(pAVar6,fBalance,fUpdateLevel,1,fPower,fLightSynth,fVerbose);
  pGVar5 = Gia_ManFromAig(pAVar6);
  ppvVar4[2] = pGVar5;
  Aig_ManStop(pAVar6);
  pvVar1 = *ppvVar4;
  pvVar2 = ppvVar4[2];
  vGias->nSize = 3;
  ppvVar4[2] = pvVar1;
  *ppvVar4 = pvVar2;
  pGVar5 = Gia_ManChoiceMiter(vGias);
  if (0 < vGias->nSize) {
    lVar7 = 0;
    do {
      Gia_ManStop((Gia_Man_t *)vGias->pArray[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vGias->nSize);
  }
  if (vGias->pArray != (void **)0x0) {
    free(vGias->pArray);
  }
  free(vGias);
  return pGVar5;
}

Assistant:

Gia_Man_t * Dar_NewChoiceSynthesis( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fPower, int fLightSynth, int fVerbose )
//alias resyn    "b; rw; rwz; b; rwz; b"
//alias resyn2   "b; rw; rf; b; rw; rwz; b; rfz; rwz; b"
{
    Vec_Ptr_t * vGias;
    Gia_Man_t * pGia, * pTemp;
    int i;

    if ( fUpdateLevel && Dar_NewChoiceSynthesisGuard(pAig) )
    {
        if ( fVerbose )
            printf( "Warning: Due to high fanout count of some nodes, level updating is disabled.\n" );
        fUpdateLevel = 0;
    }

    vGias = Vec_PtrAlloc( 3 );
    pGia = Gia_ManFromAig(pAig);
    Vec_PtrPush( vGias, pGia );

    pAig = Dar_NewCompress( pAig, fBalance, fUpdateLevel, fPower, fVerbose );
    pGia = Gia_ManFromAig(pAig);
    Vec_PtrPush( vGias, pGia );
//Aig_ManPrintStats( pAig );

    pAig = Dar_NewCompress2( pAig, fBalance, fUpdateLevel, 1, fPower, fLightSynth, fVerbose );
    pGia = Gia_ManFromAig(pAig);
    Vec_PtrPush( vGias, pGia );
//Aig_ManPrintStats( pAig );

    Aig_ManStop( pAig );

    // swap around the first and the last
    pTemp = (Gia_Man_t *)Vec_PtrPop( vGias );
    Vec_PtrPush( vGias, Vec_PtrEntry(vGias,0) );
    Vec_PtrWriteEntry( vGias, 0, pTemp );

//    Aig_Man_t * pAig;
//    int i;
//    printf( "Choicing will be performed with %d AIGs:\n", Vec_PtrSize(p->vAigs) );
//    Vec_PtrForEachEntry( Aig_Man_t *, p->vAigs, pAig, i )
//        Aig_ManPrintStats( pAig );

    // derive the miter
    pGia = Gia_ManChoiceMiter( vGias );

    // cleanup
    Vec_PtrForEachEntry( Gia_Man_t *, vGias, pTemp, i )
        Gia_ManStop( pTemp );
    Vec_PtrFree( vGias );
    return pGia;
}